

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

App * __thiscall
CLI::App::add_subcommand(App *this,string *subcommand_name,string *subcommand_description)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char c;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  bool bVar5;
  App *pAVar6;
  IncorrectConstruction *this_00;
  undefined1 *puVar7;
  bool bVar8;
  App_p subcom;
  App *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  undefined1 local_c8 [64];
  string local_88;
  App_p local_68;
  string local_50;
  
  if (subcommand_name->_M_string_length == 0) {
LAB_00115ec9:
    local_d8 = (App *)operator_new(800);
    local_c8._16_8_ = (subcommand_description->_M_dataplus)._M_p;
    paVar1 = &subcommand_description->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._16_8_ == paVar1) {
      local_c8._32_8_ = paVar1->_M_allocated_capacity;
      local_c8._40_4_ = *(undefined4 *)((long)&subcommand_description->field_2 + 8);
      local_c8._44_4_ = *(undefined4 *)((long)&subcommand_description->field_2 + 0xc);
      local_c8._16_8_ = local_c8 + 0x20;
    }
    else {
      local_c8._32_8_ = paVar1->_M_allocated_capacity;
    }
    local_c8._24_8_ = subcommand_description->_M_string_length;
    (subcommand_description->_M_dataplus)._M_p = (pointer)paVar1;
    subcommand_description->_M_string_length = 0;
    (subcommand_description->field_2)._M_local_buf[0] = '\0';
    pcVar2 = (subcommand_name->_M_dataplus)._M_p;
    local_88._M_dataplus._M_p = local_c8 + 0x50;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_c8 + 0x40),pcVar2,pcVar2 + subcommand_name->_M_string_length);
    App(local_d8,(string *)(local_c8 + 0x10),(string *)(local_c8 + 0x40),this);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CLI::App*>
              (&_Stack_d0,local_d8);
    if (local_88._M_dataplus._M_p != local_c8 + 0x50) {
      operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((undefined1 *)local_c8._16_8_ != local_c8 + 0x20) {
      operator_delete((void *)local_c8._16_8_,local_c8._32_8_ + 1);
    }
    local_68.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
    local_68.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_d0._M_pi;
    local_d8 = (App *)0x0;
    _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pAVar6 = add_subcommand(this,(App_p *)(local_c8 + 0x60));
    if (local_68.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_d0._M_pi);
    }
    return pAVar6;
  }
  bVar4 = detail::valid_first_char<char>(*(subcommand_name->_M_dataplus)._M_p);
  if (bVar4) {
    ::std::__cxx11::string::substr((ulong)&local_d8,(ulong)subcommand_name);
    pAVar6 = local_d8;
    if (_Stack_d0._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar4 = true;
    }
    else {
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(_Stack_d0._M_pi + -1);
      puVar7 = (undefined1 *)0x0;
      local_c8._48_8_ = subcommand_name;
      local_c8._56_8_ = this;
      do {
        c = puVar7[(long)&pAVar6->_vptr_App];
        bVar5 = detail::valid_first_char<char>(c);
        bVar8 = (byte)(c - 0x2dU) < 2;
        bVar4 = bVar5 || bVar8;
        this = (App *)local_c8._56_8_;
        subcommand_name = (string *)local_c8._48_8_;
        if (!bVar5 && !bVar8) break;
        bVar5 = (undefined1 *)((long)&p_Var3->_M_weak_count + 3) != puVar7;
        puVar7 = puVar7 + 1;
      } while (bVar5);
    }
    if (local_d8 != (App *)local_c8) {
      operator_delete(local_d8,local_c8._0_8_ + 1);
    }
    if (bVar4) goto LAB_00115ec9;
  }
  this_00 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"subcommand name is not valid","");
  IncorrectConstruction::IncorrectConstruction(this_00,&local_50);
  __cxa_throw(this_00,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

App *add_subcommand(std::string subcommand_name = "", std::string subcommand_description = "") {
        if(!subcommand_name.empty() && !detail::valid_name_string(subcommand_name)) {
            throw IncorrectConstruction("subcommand name is not valid");
        }
        CLI::App_p subcom = std::shared_ptr<App>(new App(std::move(subcommand_description), subcommand_name, this));
        return add_subcommand(std::move(subcom));
    }